

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::FileGenerator::Generate(FileGenerator *this,Printer *printer)

{
  Params *this_00;
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  FieldDescriptor *descriptor;
  EnumDescriptor *descriptor_00;
  string *file_name;
  Descriptor *pDVar5;
  MessageGenerator local_110;
  int local_e4;
  undefined1 local_e0 [4];
  int i_3;
  int local_b4;
  undefined1 local_b0 [4];
  int i_2;
  int local_70;
  int i_1;
  ExtensionGenerator local_60;
  int local_1c;
  Printer *pPStack_18;
  int i;
  Printer *printer_local;
  FileGenerator *this_local;
  
  pPStack_18 = printer;
  printer_local = (Printer *)this;
  io::Printer::Print(printer,"// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    io::Printer::Print(pPStack_18,"\npackage $package$;\n","package",&this->java_package_);
  }
  io::Printer::Print(pPStack_18,"\n@SuppressWarnings(\"hiding\")\npublic interface $classname$ {\n",
                     "classname",&this->classname_);
  io::Printer::Indent(pPStack_18);
  for (local_1c = 0; iVar1 = local_1c, iVar3 = FileDescriptor::extension_count(this->file_),
      iVar1 < iVar3; local_1c = local_1c + 1) {
    descriptor = FileDescriptor::extension(this->file_,local_1c);
    ExtensionGenerator::ExtensionGenerator(&local_60,descriptor,this->params_);
    ExtensionGenerator::Generate(&local_60,pPStack_18);
    ExtensionGenerator::~ExtensionGenerator(&local_60);
  }
  for (local_70 = 0; iVar1 = local_70, iVar3 = FileDescriptor::enum_type_count(this->file_),
      iVar1 < iVar3; local_70 = local_70 + 1) {
    descriptor_00 = FileDescriptor::enum_type(this->file_,local_70);
    EnumGenerator::EnumGenerator((EnumGenerator *)local_b0,descriptor_00,this->params_);
    EnumGenerator::Generate((EnumGenerator *)local_b0,pPStack_18);
    EnumGenerator::~EnumGenerator((EnumGenerator *)local_b0);
  }
  this_00 = this->params_;
  file_name = FileDescriptor::name_abi_cxx11_(this->file_);
  bVar2 = Params::java_multiple_files(this_00,file_name);
  if (!bVar2) {
    for (local_b4 = 0; iVar1 = local_b4, iVar3 = FileDescriptor::message_type_count(this->file_),
        iVar1 < iVar3; local_b4 = local_b4 + 1) {
      pDVar5 = FileDescriptor::message_type(this->file_,local_b4);
      MessageGenerator::MessageGenerator((MessageGenerator *)local_e0,pDVar5,this->params_);
      MessageGenerator::Generate((MessageGenerator *)local_e0,pPStack_18);
      MessageGenerator::~MessageGenerator((MessageGenerator *)local_e0);
    }
  }
  for (local_e4 = 0; iVar1 = local_e4, iVar3 = FileDescriptor::message_type_count(this->file_),
      iVar1 < iVar3; local_e4 = local_e4 + 1) {
    pDVar5 = FileDescriptor::message_type(this->file_,local_e4);
    MessageGenerator::MessageGenerator(&local_110,pDVar5,this->params_);
    MessageGenerator::GenerateStaticVariables(&local_110,pPStack_18);
    MessageGenerator::~MessageGenerator(&local_110);
  }
  io::Printer::Outdent(pPStack_18);
  io::Printer::Print(pPStack_18,"}\n");
  return;
}

Assistant:

void FileGenerator::Generate(io::Printer* printer) {
  // We don't import anything because we refer to all classes by their
  // fully-qualified names in the generated source.
  printer->Print(
    "// Generated by the protocol buffer compiler.  DO NOT EDIT!\n");
  if (!java_package_.empty()) {
    printer->Print(
      "\n"
      "package $package$;\n",
      "package", java_package_);
  }

  // Note: constants (from enums, emitted in the loop below) may have the same names as constants
  // in the nested classes. This causes Java warnings, but is not fatal, so we suppress those
  // warnings here in the top-most class declaration.
  printer->Print(
    "\n"
    "@SuppressWarnings(\"hiding\")\n"
    "public interface $classname$ {\n",
    "classname", classname_);
  printer->Indent();

  // -----------------------------------------------------------------

  // Extensions.
  for (int i = 0; i < file_->extension_count(); i++) {
    ExtensionGenerator(file_->extension(i), params_).Generate(printer);
  }

  // Enums.
  for (int i = 0; i < file_->enum_type_count(); i++) {
    EnumGenerator(file_->enum_type(i), params_).Generate(printer);
  }

  // Messages.
  if (!params_.java_multiple_files(file_->name())) {
    for (int i = 0; i < file_->message_type_count(); i++) {
      MessageGenerator(file_->message_type(i), params_).Generate(printer);
    }
  }

  // Static variables.
  for (int i = 0; i < file_->message_type_count(); i++) {
    // TODO(kenton):  Reuse MessageGenerator objects?
    MessageGenerator(file_->message_type(i), params_).GenerateStaticVariables(printer);
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}